

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall HighsDomain::recomputeCapacityThreshold(HighsDomain *this,HighsInt row)

{
  double dVar1;
  int iVar2;
  int iVar3;
  HighsMipSolverData *pHVar4;
  pointer pdVar5;
  long lVar6;
  HighsInt i;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  initializer_list<double> __l;
  double local_48;
  double local_40;
  double local_38;
  
  pdVar5 = (this->capacityThreshold_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar4 = (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  lVar6 = (long)row;
  lVar7 = *(long *)&(pHVar4->ARstart_).super__Vector_base<int,_std::allocator<int>_>._M_impl;
  iVar2 = *(int *)(lVar7 + lVar6 * 4);
  iVar3 = *(int *)(lVar7 + 4 + lVar6 * 4);
  pdVar5[lVar6] = -pHVar4->feastol;
  for (lVar7 = (long)iVar2; lVar7 < iVar3; lVar7 = lVar7 + 1) {
    pHVar4 = (this->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    iVar2 = *(int *)(*(long *)&(pHVar4->ARindex_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl + lVar7 * 4);
    dVar8 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2];
    dVar1 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2];
    if ((dVar8 != dVar1) || (NAN(dVar8) || NAN(dVar1))) {
      local_38 = pHVar4->feastol;
      dVar9 = local_38;
      if ((this->mipsolver->model_->integrality_).
          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2] == kContinuous) {
        dVar10 = (dVar8 - dVar1) * 0.3;
        dVar9 = local_38 * 1000.0;
        if (local_38 * 1000.0 <= dVar10) {
          dVar9 = dVar10;
        }
      }
      local_40 = ((dVar8 - dVar1) - dVar9) *
                 ABS(*(double *)
                      (*(long *)&(pHVar4->ARvalue_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl +
                      lVar7 * 8));
      local_48 = pdVar5[lVar6];
      __l._M_len = 3;
      __l._M_array = &local_48;
      dVar8 = std::max<double>(__l);
      pdVar5 = (this->capacityThreshold_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar5[lVar6] = dVar8;
    }
  }
  return;
}

Assistant:

void HighsDomain::recomputeCapacityThreshold(HighsInt row) {
  HighsInt start = mipsolver->mipdata_->ARstart_[row];
  HighsInt end = mipsolver->mipdata_->ARstart_[row + 1];

  capacityThreshold_[row] = -feastol();
  for (HighsInt i = start; i < end; ++i) {
    HighsInt col = mipsolver->mipdata_->ARindex_[i];

    if (col_upper_[col] == col_lower_[col]) continue;

    double threshold = std::fabs(mipsolver->mipdata_->ARvalue_[i]) *
                       boundRange(col_upper_[col], col_lower_[col], feastol(),
                                  variableType(col));

    capacityThreshold_[row] =
        std::max({capacityThreshold_[row], threshold, feastol()});
  }
}